

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

void CServerBrowserFavorites::ConfigSaveCallback(IConfigManager *pConfigManager,void *pUserData)

{
  long lVar1;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  CServerBrowserFavorites *pSelf;
  char aBuffer [320];
  int local_164;
  char local_148 [144];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_164 = 0; local_164 < *(int *)(in_RSI + 0xbc00); local_164 = local_164 + 1) {
    if (*(char *)(in_RSI + (long)local_164 * 0xbc + 0x80) == '\0') {
      str_format(local_148,0x140,"add_favorite \"%s\"",in_RSI + (long)local_164 * 0xbc);
    }
    else {
      str_format(local_148,0x140,"add_favorite \"%s\" \"%s\"",in_RSI + (long)local_164 * 0xbc,
                 in_RSI + (long)local_164 * 0xbc + 0x80);
    }
    (**(code **)(*in_RDI + 0x40))(in_RDI,local_148);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowserFavorites::ConfigSaveCallback(IConfigManager *pConfigManager, void *pUserData)
{
	CServerBrowserFavorites *pSelf = (CServerBrowserFavorites *)pUserData;

	char aBuffer[320];
	for(int i = 0; i < pSelf->m_NumFavoriteServers; i++)
	{
		if(pSelf->m_aFavoriteServers[i].m_aPassword[0])
			str_format(aBuffer, sizeof(aBuffer), "add_favorite \"%s\" \"%s\"", pSelf->m_aFavoriteServers[i].m_aHostname, pSelf->m_aFavoriteServers[i].m_aPassword);
		else
			str_format(aBuffer, sizeof(aBuffer), "add_favorite \"%s\"", pSelf->m_aFavoriteServers[i].m_aHostname);
		pConfigManager->WriteLine(aBuffer);
	}
}